

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_update_state(AV1_COMP *cpi,ThreadData_conflict *td,PICK_MODE_CONTEXT *ctx,int mi_row,
                     int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  CommonModeInfoParams *mi_params;
  uint64_t *puVar1;
  int *piVar2;
  CANDIDATE_MV *pCVar3;
  uint *puVar4;
  uint8_t uVar5;
  BLOCK_SIZE BVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  _Bool _Var11;
  char cVar12;
  int iVar13;
  MB_MODE_INFO *__dest;
  MB_MODE_INFO *pMVar14;
  MB_MODE_INFO *pMVar15;
  FRAME_COUNTS *pFVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  CANDIDATE_MV CVar21;
  CANDIDATE_MV CVar22;
  CANDIDATE_MV CVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  AQ_MODE AVar27;
  CFL_ALLOWED_TYPE CVar28;
  ushort uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  EncSegmentationInfo *pEVar34;
  tran_low_t **pptVar35;
  undefined4 uVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  int dir;
  int mi_row_00;
  uint uVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  uint8_t *puVar44;
  uint8_t *puVar45;
  byte bVar46;
  ulong uVar47;
  ulong uVar48;
  uint uVar49;
  ulong uVar50;
  undefined7 in_register_00000089;
  uint uVar51;
  bool bVar52;
  short sVar53;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  
  uVar5 = ((cpi->common).seq_params)->monochrome;
  __dest = *(td->mb).e_mbd.mi;
  BVar6 = (ctx->mic).bsize;
  bVar7 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar6];
  uVar49 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar6]
  ;
  iVar41 = (cpi->common).mi_params.mi_stride;
  uVar33 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar33];
  bVar9 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar33];
  memcpy(__dest,ctx,0xb0);
  bVar46 = (ctx->mic).ref_frame[0];
  bVar10 = (ctx->mic).ref_frame[1];
  if ('\0' < (char)bVar10) {
    if (bVar10 < 5 || '\x04' < (char)bVar46) {
      for (lVar42 = 0; lVar42 != 9; lVar42 = lVar42 + 1) {
        if ((bVar46 == (&comp_ref0_lut)[lVar42]) && (bVar10 == (&comp_ref1_lut)[lVar42])) {
          bVar46 = (char)lVar42 + 0x14;
          goto LAB_0019577f;
        }
      }
    }
    bVar46 = (bVar10 * '\x04' + bVar46) - 0xd;
  }
LAB_0019577f:
  cm = &cpi->common;
  xd = &(td->mb).e_mbd;
  CVar21 = (ctx->mbmi_ext_best).ref_mv_stack[0];
  CVar22 = (ctx->mbmi_ext_best).ref_mv_stack[1];
  CVar23 = (ctx->mbmi_ext_best).ref_mv_stack[3];
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar46] + 2;
  *pCVar3 = (ctx->mbmi_ext_best).ref_mv_stack[2];
  pCVar3[1] = CVar23;
  pCVar3 = (td->mb).mbmi_ext.ref_mv_stack[bVar46];
  *pCVar3 = CVar21;
  pCVar3[1] = CVar22;
  (td->mb).mbmi_ext.weight[bVar46] = *&(ctx->mbmi_ext_best).weight;
  (td->mb).mbmi_ext.mode_context[bVar46] = (ctx->mbmi_ext_best).mode_context;
  (td->mb).mbmi_ext.ref_mv_count[bVar46] = (ctx->mbmi_ext_best).ref_mv_count;
  uVar24 = *(undefined8 *)(ctx->mbmi_ext_best).global_mvs;
  uVar25 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 2);
  uVar26 = *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 6);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 4) =
       *(undefined8 *)((ctx->mbmi_ext_best).global_mvs + 4);
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 6) = uVar26;
  *(undefined8 *)(td->mb).mbmi_ext.global_mvs = uVar24;
  *(undefined8 *)((td->mb).mbmi_ext.global_mvs + 2) = uVar25;
  memcpy((td->mb).txfm_search_info.blk_skip,ctx->blk_skip,(long)ctx->num_4x4_blk);
  (td->mb).txfm_search_info.skip_txfm = (ctx->rd_stats).skip_txfm;
  (td->mb).e_mbd.tx_type_map = ctx->tx_type_map;
  (td->mb).e_mbd.tx_type_map_stride = (uint)bVar8;
  if (dry_run == '\0') {
    uVar37 = (cpi->common).mi_params.mi_stride;
    uVar33 = (ulong)uVar37;
    puVar44 = (cpi->common).mi_params.tx_type_map + (int)(uVar37 * mi_row + mi_col);
    puVar45 = puVar44;
    for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
      memcpy(puVar45,(td->mb).e_mbd.tx_type_map + (long)(td->mb).e_mbd.tx_type_map_stride * uVar39,
             (ulong)bVar7);
      puVar45 = puVar45 + (int)uVar37;
    }
    (td->mb).e_mbd.tx_type_map = puVar44;
    (td->mb).e_mbd.tx_type_map_stride = uVar37;
    if ((cpi->common).seg.enabled != '\0') goto LAB_00195915;
  }
  else {
    if ((cpi->common).seg.enabled == '\0') goto LAB_00195d48;
LAB_00195915:
    uVar39 = (ulong)(uint)mi_col;
    mi_params = &(cpi->common).mi_params;
    AVar27 = (cpi->oxcf).q_cfg.aq_mode;
    uVar33 = 0;
    if (AVar27 == '\x02') {
      pEVar34 = &cpi->enc_seg;
      if ((cpi->common).seg.update_map == '\0') {
        pEVar34 = (EncSegmentationInfo *)&(cpi->common).last_frame_seg_map;
      }
      if (pEVar34->map == (uint8_t *)0x0) {
        uVar29 = 0;
      }
      else {
        bVar46 = get_segment_id(mi_params,pEVar34->map,bsize,mi_row,mi_col);
        uVar29 = (ushort)(bVar46 & 7);
      }
      uVar37 = *(ushort *)&__dest->field_0xa7 & 0xfffffff8;
      uVar33 = (ulong)uVar37;
      *(ushort *)&__dest->field_0xa7 = uVar29 | (ushort)uVar37;
      AVar27 = (cpi->oxcf).q_cfg.aq_mode;
    }
    if (((AVar27 == '\x03') && ((~*(ushort *)&__dest->field_0xa7 & 7) != 0)) &&
       ((cpi->rc).rtc_external_ratectrl == 0)) {
      av1_cyclic_refresh_update_segment
                (cpi,&td->mb,mi_row,mi_col,bsize,(long)(ctx->rd_stats).rate,(ctx->rd_stats).dist,
                 (uint)(td->mb).txfm_search_info.skip_txfm,dry_run);
      uVar33 = uVar39;
    }
    if ((__dest->uv_mode == '\r') && (CVar28 = is_cfl_allowed(xd), CVar28 == '\0')) {
      __dest->uv_mode = '\0';
    }
    if (dry_run != '\0') goto LAB_00195d48;
    if (__dest->skip_txfm != '\0') goto LAB_00195cb3;
    iVar43 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
    iVar32 = (td->mb).e_mbd.mi_row;
    iVar13 = (td->mb).e_mbd.mi_col;
    puVar45 = ((cpi->common).cur_frame)->seg_map;
    _Var11 = (td->mb).e_mbd.left_available;
    if ((td->mb).e_mbd.up_available == false) {
      uVar51 = 0xff;
      uVar37 = 0xff;
      uVar31 = 0xff;
      if ((_Var11 & 1U) != 0) goto LAB_00195b45;
LAB_00195b66:
      uVar51 = 0xff;
      uVar40 = 0;
      uVar30 = uVar37;
    }
    else {
      mi_row_00 = iVar32 - iVar43;
      uVar51 = 0xff;
      if ((_Var11 & 1U) != 0) {
        bVar46 = get_segment_id(mi_params,puVar45,BLOCK_4X4,mi_row_00,iVar13 - iVar43);
        uVar51 = (uint)bVar46;
      }
      bVar46 = get_segment_id(mi_params,puVar45,BLOCK_4X4,mi_row_00,iVar13);
      uVar37 = (uint)bVar46;
      uVar31 = 0xff;
      if ((_Var11 & 1U) != 0) {
LAB_00195b45:
        bVar46 = get_segment_id(mi_params,puVar45,BLOCK_4X4,iVar32,iVar13 - iVar43);
        uVar31 = (uint)bVar46;
      }
      if (uVar51 == 0xff) goto LAB_00195b66;
      if ((uVar51 == uVar37) && (uVar51 == uVar31)) {
        uVar40 = 2;
        uVar30 = uVar51;
      }
      else {
        uVar40 = (uint)((uVar31 == uVar37 || uVar51 == uVar31) || uVar51 == uVar37);
        uVar30 = uVar37;
      }
    }
    if ((char)uVar37 == -1) {
      uVar37 = 0;
      if (uVar31 != 0xff) {
        uVar37 = uVar31;
      }
    }
    else if ((uVar31 != 0xff) && (uVar37 = uVar31, uVar51 == uVar30)) {
      uVar37 = uVar30;
    }
    uVar37 = av1_neg_interleave(*(ushort *)&__dest->field_0xa7 & 7,uVar37,
                                (cpi->common).seg.last_active_segid + 1);
    lVar42 = (long)*(int *)((long)(td->mb).mode_costs.spatial_pred_cost[0] +
                           (ulong)(uVar37 & 0xff) * 4 + (ulong)(uVar40 << 5));
    puVar1 = (td->rd_counts).seg_tmp_pred_cost;
    *puVar1 = *puVar1 + lVar42;
    puVar45 = (cpi->common).last_frame_seg_map;
    if (puVar45 == (uint8_t *)0x0) {
      uVar29 = 0;
    }
    else {
      bVar46 = get_segment_id(mi_params,puVar45,bsize,mi_row,mi_col);
      uVar29 = (ushort)bVar46;
    }
    pMVar14 = (td->mb).e_mbd.left_mbmi;
    pMVar15 = (td->mb).e_mbd.above_mbmi;
    if (pMVar15 == (MB_MODE_INFO *)0x0) {
      uVar37 = 0;
    }
    else {
      uVar37 = *(ushort *)&pMVar15->field_0xa7 >> 3 & 1;
    }
    uVar33 = 0;
    if (pMVar14 == (MB_MODE_INFO *)0x0) {
      uVar31 = 0;
    }
    else {
      uVar31 = *(ushort *)&pMVar14->field_0xa7 >> 3 & 1;
    }
    bVar52 = uVar29 == (*(ushort *)&__dest->field_0xa7 & 7);
    if (bVar52) {
      lVar42 = 0;
    }
    puVar1 = (td->rd_counts).seg_tmp_pred_cost + 1;
    *puVar1 = *puVar1 + lVar42 + (td->mb).mode_costs.tmp_pred_cost[uVar31 + uVar37][bVar52];
  }
LAB_00195cb3:
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    bVar52 = ((ctx->mic).field_0xa7 & 0x80) == 0;
    cVar12 = (ctx->mic).ref_frame[0];
    if (!bVar52 || '\0' < cVar12) {
      uVar39 = *(ulong *)(ctx->mic).mv;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar39;
      sVar53 = (short)uVar39;
      sVar17 = -sVar53;
      sVar57 = (short)(uVar39 >> 0x10);
      sVar18 = -sVar57;
      sVar58 = (short)(uVar39 >> 0x20);
      sVar19 = -sVar58;
      sVar59 = (short)(uVar39 >> 0x30);
      sVar20 = -sVar59;
      auVar60._0_2_ = (ushort)(sVar17 < sVar53) * sVar53 | (ushort)(sVar17 >= sVar53) * sVar17;
      auVar60._2_2_ = (ushort)(sVar18 < sVar57) * sVar57 | (ushort)(sVar18 >= sVar57) * sVar18;
      auVar60._4_2_ = (ushort)(sVar19 < sVar58) * sVar58 | (ushort)(sVar19 >= sVar58) * sVar19;
      auVar60._6_2_ = (ushort)(sVar20 < sVar59) * sVar59 | (ushort)(sVar20 >= sVar59) * sVar20;
      auVar60._8_8_ = 0;
      auVar54 = pshuflw(auVar54,auVar60,0x50);
      auVar55._0_4_ = auVar54._0_4_;
      auVar55._4_4_ = auVar55._0_4_;
      auVar55._8_4_ = auVar54._4_4_;
      auVar55._12_4_ = auVar54._4_4_;
      auVar55 = auVar55 ^ _DAT_00434a80;
      auVar56._0_2_ = -(ushort)(-0x7ff9 < auVar55._0_2_);
      auVar56._2_2_ = -(ushort)(-0x7ff9 < auVar55._2_2_);
      auVar56._4_2_ = -(ushort)(-0x7ff9 < auVar55._4_2_);
      auVar56._6_2_ = -(ushort)(-0x7ff9 < auVar55._6_2_);
      auVar56._8_2_ = -(ushort)(-0x7ff9 < auVar55._8_2_);
      auVar56._10_2_ = -(ushort)(-0x7ff9 < auVar55._10_2_);
      auVar56._12_2_ = -(ushort)(-0x7ff9 < auVar55._12_2_);
      auVar56._14_2_ = -(ushort)(-0x7ff9 < auVar55._14_2_);
      uVar36 = movmskpd((int)CONCAT71((int7)(uVar33 >> 8),bVar52),auVar56);
      bVar46 = (byte)uVar36 ^ 3;
      if ((byte)((bVar46 & 2) >> 1 & cVar12 == '\x01' & bVar46) == 1) {
        uVar37 = (cpi->common).mi_params.mi_rows - mi_row;
        if ((int)uVar49 <= (int)uVar37) {
          uVar37 = uVar49;
        }
        for (iVar32 = 0; iVar32 < (int)uVar37; iVar32 = iVar32 + 2) {
          piVar2 = &(td->mb).cnt_zeromv;
          *piVar2 = *piVar2 + (uint)bVar7 * 2;
        }
      }
    }
  }
LAB_00195d48:
  pptVar35 = ctx->coeff;
  lVar42 = 0x11;
  if (uVar5 == '\0') {
    lVar42 = 0x33;
  }
  for (lVar38 = 0; lVar42 != lVar38; lVar38 = lVar38 + 0x11) {
    (&(td->mb).plane[0].coeff)[lVar38] = *pptVar35;
    (&(td->mb).plane[0].qcoeff)[lVar38] = pptVar35[3];
    (&(td->mb).plane[0].dqcoeff)[lVar38] = pptVar35[6];
    (&(td->mb).plane[0].eobs)[lVar38] = (uint16_t *)pptVar35[9];
    (&(td->mb).plane[0].txb_entropy_ctx)[lVar38] = (uint8_t *)pptVar35[0xc];
    pptVar35 = pptVar35 + 1;
  }
  (td->mb).e_mbd.plane[0].color_index_map = ctx->color_index_map[0];
  (td->mb).e_mbd.plane[1].color_index_map = ctx->color_index_map[1];
  iVar32 = (td->mb).e_mbd.mb_to_right_edge;
  iVar13 = (td->mb).e_mbd.mb_to_bottom_edge;
  uVar31 = (iVar32 >> 0x1f & iVar32 >> 5) + (uint)bVar8;
  uVar37 = (iVar13 >> 0x1f & iVar13 >> 5) + (uint)bVar9;
  uVar39 = 0;
  uVar33 = (ulong)uVar31;
  if ((int)uVar31 < 1) {
    uVar33 = uVar39;
  }
  if ((int)uVar37 < 1) {
    uVar37 = 0;
  }
  for (uVar47 = 0; uVar48 = uVar33, uVar50 = uVar39, uVar47 != uVar37; uVar47 = uVar47 + 1) {
    while (uVar48 != 0) {
      *(MB_MODE_INFO **)((long)(td->mb).e_mbd.mi + uVar50) = __dest;
      uVar48 = uVar48 - 1;
      uVar50 = uVar50 + 8;
    }
    uVar39 = uVar39 + (long)iVar41 * 8;
  }
  if ((cpi->oxcf).q_cfg.aq_mode != '\0') {
    av1_init_plane_quantizers(cpi,&td->mb,*(ushort *)&__dest->field_0xa7 & 7,0);
  }
  if (dry_run == '\0') {
    if ((((cm->current_frame).frame_type & 0xfd) != 0) &&
       (((((ctx->mic).field_0xa7 & 0x80) != 0 || ('\0' < (ctx->mic).ref_frame[0])) &&
        ((cpi->common).features.interp_filter == MULTITAP_SHARP2)))) {
      pFVar16 = td->counts;
      for (iVar41 = 0; iVar41 != 2; iVar41 = iVar41 + 1) {
        iVar32 = av1_get_pred_context_switchable_interp(xd,iVar41);
        uVar37 = (__dest->interp_filters).as_int >> 0x10;
        if (iVar41 == 0) {
          uVar37 = (__dest->interp_filters).as_int;
        }
        puVar4 = pFVar16->switchable_interp[iVar32] + ((ulong)uVar37 & 0xff);
        *puVar4 = *puVar4 + 1;
      }
    }
    if ((((cpi->common).seq_params)->order_hint_info).enable_ref_frame_mvs != 0) {
      uVar37 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)uVar49 <= (int)uVar37) {
        uVar37 = uVar49;
      }
      uVar49 = (cpi->common).mi_params.mi_cols - mi_col;
      if ((int)(uint)bVar7 <= (int)uVar49) {
        uVar49 = (uint)bVar7;
      }
      av1_copy_frame_mvs(cm,&ctx->mic,mi_row,mi_col,uVar49,uVar37);
      return;
    }
  }
  return;
}

Assistant:

void av1_update_state(const AV1_COMP *const cpi, ThreadData *td,
                      const PICK_MODE_CONTEXT *const ctx, int mi_row,
                      int mi_col, BLOCK_SIZE bsize, RUN_TYPE dry_run) {
  int i, x_idx, y;
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const MB_MODE_INFO *const mi = &ctx->mic;
  MB_MODE_INFO *const mi_addr = xd->mi[0];
  const struct segmentation *const seg = &cm->seg;
  assert(bsize < BLOCK_SIZES_ALL);
  const int bw = mi_size_wide[mi->bsize];
  const int bh = mi_size_high[mi->bsize];
  const int mis = mi_params->mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  assert(mi->bsize == bsize);

  *mi_addr = *mi;
  copy_mbmi_ext_frame_to_mbmi_ext(&x->mbmi_ext, &ctx->mbmi_ext_best,
                                  av1_ref_frame_type(ctx->mic.ref_frame));

  memcpy(txfm_info->blk_skip, ctx->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);

  txfm_info->skip_txfm = ctx->rd_stats.skip_txfm;

  xd->tx_type_map = ctx->tx_type_map;
  xd->tx_type_map_stride = mi_size_wide[bsize];
  // If not dry_run, copy the transform type data into the frame level buffer.
  // Encoder will fetch tx types when writing bitstream.
  if (!dry_run) {
    const int grid_idx = get_mi_grid_idx(mi_params, mi_row, mi_col);
    uint8_t *const tx_type_map = mi_params->tx_type_map + grid_idx;
    const int mi_stride = mi_params->mi_stride;
    for (int blk_row = 0; blk_row < bh; ++blk_row) {
      av1_copy_array(tx_type_map + blk_row * mi_stride,
                     xd->tx_type_map + blk_row * xd->tx_type_map_stride, bw);
    }
    xd->tx_type_map = tx_type_map;
    xd->tx_type_map_stride = mi_stride;
  }

  // If segmentation in use
  if (seg->enabled) {
    // For in frame complexity AQ copy the segment id from the segment map.
    if (cpi->oxcf.q_cfg.aq_mode == COMPLEXITY_AQ) {
      const uint8_t *const map =
          seg->update_map ? cpi->enc_seg.map : cm->last_frame_seg_map;
      mi_addr->segment_id =
          map ? get_segment_id(mi_params, map, bsize, mi_row, mi_col) : 0;
    }
    // Else for cyclic refresh mode update the segment map, set the segment id
    // and then update the quantizer.
    if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
        mi_addr->segment_id != AM_SEGMENT_ID_INACTIVE &&
        !cpi->rc.rtc_external_ratectrl) {
      av1_cyclic_refresh_update_segment(cpi, x, mi_row, mi_col, bsize,
                                        ctx->rd_stats.rate, ctx->rd_stats.dist,
                                        txfm_info->skip_txfm, dry_run);
    }
    if (mi_addr->uv_mode == UV_CFL_PRED && !is_cfl_allowed(xd))
      mi_addr->uv_mode = UV_DC_PRED;

    if (!dry_run && !mi_addr->skip_txfm) {
      int cdf_num;
      const uint8_t spatial_pred = av1_get_spatial_seg_pred(
          cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
      const uint8_t coded_id = av1_neg_interleave(
          mi_addr->segment_id, spatial_pred, seg->last_active_segid + 1);
      int64_t spatial_cost = x->mode_costs.spatial_pred_cost[cdf_num][coded_id];
      td->rd_counts.seg_tmp_pred_cost[0] += spatial_cost;

      const int pred_segment_id =
          cm->last_frame_seg_map
              ? get_segment_id(mi_params, cm->last_frame_seg_map, bsize, mi_row,
                               mi_col)
              : 0;
      const int use_tmp_pred = pred_segment_id == mi_addr->segment_id;
      const uint8_t tmp_pred_ctx = av1_get_pred_context_seg_id(xd);
      td->rd_counts.seg_tmp_pred_cost[1] +=
          x->mode_costs.tmp_pred_cost[tmp_pred_ctx][use_tmp_pred];
      if (!use_tmp_pred) {
        td->rd_counts.seg_tmp_pred_cost[1] += spatial_cost;
      }
    }
  }

  // Count zero motion vector.
  if (!dry_run && !frame_is_intra_only(cm)) {
    const MV mv = mi->mv[0].as_mv;
    if (is_inter_block(mi) && mi->ref_frame[0] == LAST_FRAME &&
        abs(mv.row) < 8 && abs(mv.col) < 8) {
      const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);
      // Accumulate low_content_frame.
      for (int mi_y = 0; mi_y < ymis; mi_y += 2) x->cnt_zeromv += bw << 1;
    }
  }

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }
  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];
  // Restore the coding context of the MB to that that was in place
  // when the mode was picked for it

  const int cols =
      AOMMIN((xd->mb_to_right_edge >> (3 + MI_SIZE_LOG2)) + mi_width, mi_width);
  const int rows = AOMMIN(
      (xd->mb_to_bottom_edge >> (3 + MI_SIZE_LOG2)) + mi_height, mi_height);
  for (y = 0; y < rows; y++) {
    for (x_idx = 0; x_idx < cols; x_idx++) xd->mi[x_idx + y * mis] = mi_addr;
  }

  if (cpi->oxcf.q_cfg.aq_mode)
    av1_init_plane_quantizers(cpi, x, mi_addr->segment_id, 0);

  if (dry_run) return;

#if CONFIG_INTERNAL_STATS
  {
    unsigned int *const mode_chosen_counts =
        (unsigned int *)cpi->mode_chosen_counts;  // Cast const away.
    if (frame_is_intra_only(cm)) {
      static const int kf_mode_index[] = {
        THR_DC /*DC_PRED*/,
        THR_V_PRED /*V_PRED*/,
        THR_H_PRED /*H_PRED*/,
        THR_D45_PRED /*D45_PRED*/,
        THR_D135_PRED /*D135_PRED*/,
        THR_D113_PRED /*D113_PRED*/,
        THR_D157_PRED /*D157_PRED*/,
        THR_D203_PRED /*D203_PRED*/,
        THR_D67_PRED /*D67_PRED*/,
        THR_SMOOTH,   /*SMOOTH_PRED*/
        THR_SMOOTH_V, /*SMOOTH_V_PRED*/
        THR_SMOOTH_H, /*SMOOTH_H_PRED*/
        THR_PAETH /*PAETH_PRED*/,
      };
      ++mode_chosen_counts[kf_mode_index[mi_addr->mode]];
    } else {
      // Note how often each mode chosen as best
      ++mode_chosen_counts[ctx->best_mode_index];
    }
  }
#endif
  if (!frame_is_intra_only(cm)) {
    if (is_inter_block(mi) && cm->features.interp_filter == SWITCHABLE) {
      // When the frame interp filter is SWITCHABLE, several cases that always
      // use the default type (EIGHTTAP_REGULAR) are described in
      // av1_is_interp_needed(). Here, we should keep the counts for all
      // applicable blocks, so the frame filter resetting decision in
      // fix_interp_filter() is made correctly.
      update_filter_type_count(td->counts, xd, mi_addr);
    }
  }

  const int x_mis = AOMMIN(bw, mi_params->mi_cols - mi_col);
  const int y_mis = AOMMIN(bh, mi_params->mi_rows - mi_row);
  if (cm->seq_params->order_hint_info.enable_ref_frame_mvs)
    av1_copy_frame_mvs(cm, mi, mi_row, mi_col, x_mis, y_mis);
}